

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.h
# Opt level: O2

void __thiscall calculator::Reader::set_buffer(Reader *this,string *s)

{
  int iVar1;
  char *__dest;
  ulong uVar2;
  
  if (this->sbuffer_ != (char *)0x0) {
    operator_delete__(this->sbuffer_);
    this->sbuffer_ = (char *)0x0;
  }
  uVar2 = s->_M_string_length;
  iVar1 = (int)uVar2;
  this->len_ = iVar1;
  this->ptr_ = -1;
  uVar2 = -(ulong)((uVar2 & 0xffffffff) == 0) | (long)iVar1;
  __dest = (char *)operator_new__(uVar2);
  *__dest = '\0';
  memset(__dest + 1,0,uVar2 - 1);
  this->sbuffer_ = __dest;
  memcpy(__dest,(s->_M_dataplus)._M_p,(long)iVar1);
  return;
}

Assistant:

void set_buffer(const std::string& s) {
        if (sbuffer_) {
            delete[] sbuffer_;
            sbuffer_ = nullptr;
        }
        len_ = (int)s.length();
        ptr_ = -1;
        sbuffer_ = new char[len_]{0};
        memcpy(sbuffer_, s.data(), len_ * sizeof(char));
    }